

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::RAPass::process(RAPass *this,Zone *zone)

{
  long in_RSI;
  long *in_RDI;
  bool bVar1;
  CCFunc *func;
  CBNode *node;
  Error err;
  ZoneHeap *in_stack_ffffffffffffff90;
  ZoneHeap *zone_00;
  ZoneHeap *in_stack_ffffffffffffff98;
  ZoneHeap *this_00;
  Error local_5c;
  Error local_44;
  
  in_RDI[3] = in_RSI;
  ZoneHeap::reset(in_stack_ffffffffffffff98,(Zone *)in_stack_ffffffffffffff90);
  *(bool *)((long)in_RDI + 0x94) = (*(uint *)(in_RDI[1] + 0x38) & 4) != 0;
  local_5c = 0;
  this_00 = *(ZoneHeap **)(in_RDI[1] + 0x170);
  if (*(ZoneHeap **)(in_RDI[1] + 0x170) == (ZoneHeap *)0x0) {
    local_44 = 0;
  }
  else {
    do {
      zone_00 = this_00;
      this_00 = zone_00;
      if (*(char *)(zone_00->_slots + 1) == '\x10') {
        this_00 = (ZoneHeap *)zone_00[3]._slots[4];
        local_5c = (**(code **)(*in_RDI + 0x18))(in_RDI,zone_00);
        in_stack_ffffffffffffff90 = zone_00;
        if (local_5c != 0) break;
      }
      do {
        zone_00 = in_stack_ffffffffffffff90;
        this_00 = (ZoneHeap *)this_00->_slots[0];
        bVar1 = false;
        if (this_00 != (ZoneHeap *)0x0) {
          bVar1 = *(char *)(this_00->_slots + 1) != '\x10';
        }
        in_stack_ffffffffffffff90 = zone_00;
      } while (bVar1);
    } while (this_00 != (ZoneHeap *)0x0);
    ZoneHeap::reset(this_00,(Zone *)zone_00);
    in_RDI[3] = 0;
    local_44 = local_5c;
  }
  return local_44;
}

Assistant:

Error RAPass::process(Zone* zone) noexcept {
  _zone = zone;
  _heap.reset(zone);
  _emitComments = (cb()->getGlobalOptions() & CodeEmitter::kOptionLoggingEnabled) != 0;

  Error err = kErrorOk;
  CBNode* node = cc()->getFirstNode();
  if (!node) return err;

  do {
    if (node->getType() == CBNode::kNodeFunc) {
      CCFunc* func = static_cast<CCFunc*>(node);
      node = func->getEnd();

      err = compile(func);
      if (err) break;
    }

    // Find a function by skipping all nodes that are not `kNodeFunc`.
    do {
      node = node->getNext();
    } while (node && node->getType() != CBNode::kNodeFunc);
  } while (node);

  _heap.reset(nullptr);
  _zone = nullptr;
  return err;
}